

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter-basic.c
# Opt level: O0

hd_stream * hd_open_null(hd_context *ctx,hd_stream *chain,int len,hd_off_t offset)

{
  hd_error_stack_slot *phVar1;
  int iVar2;
  hd_stream *phVar3;
  undefined8 *local_28;
  null_filter *state;
  hd_off_t offset_local;
  int len_local;
  hd_stream *chain_local;
  hd_context *ctx_local;
  
  local_28 = (undefined8 *)0x0;
  state._4_4_ = len;
  if (len < 0) {
    state._4_4_ = 0;
  }
  iVar2 = hd_push_try(ctx);
  if ((iVar2 != 0) && (iVar2 = __sigsetjmp(ctx->error->top->buffer,0), iVar2 == 0)) {
    local_28 = (undefined8 *)hd_calloc(ctx,1,0x1018);
    *local_28 = chain;
    local_28[1] = (long)state._4_4_;
    local_28[2] = (long)offset;
  }
  phVar1 = ctx->error->top;
  ctx->error->top = phVar1 + -1;
  if (phVar1->code < 2) {
    phVar3 = hd_new_stream(ctx,local_28,next_null,close_null);
    return phVar3;
  }
  hd_drop_stream(ctx,chain);
  hd_rethrow(ctx);
}

Assistant:

hd_stream *
hd_open_null(hd_context *ctx, hd_stream *chain, int len, hd_off_t offset)
{
    struct null_filter *state = NULL;

    if (len < 0)
        len = 0;
    hd_try(ctx)
    {
        state = hd_malloc_struct(ctx, struct null_filter);
        state->chain = chain;
        state->remain = len;
        state->offset = offset;
    }
    hd_catch(ctx)
    {
        hd_drop_stream(ctx, chain);
        hd_rethrow(ctx);
    }

    return hd_new_stream(ctx, state, next_null, close_null);
}